

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::~Array
          (Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *this)

{
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }